

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr.cc
# Opt level: O1

void __thiscall
gimage::HighDynamicRangeFusionBase::HighDynamicRangeFusionBase(HighDynamicRangeFusionBase *this)

{
  int i;
  long lVar1;
  double dVar2;
  
  (this->list).
  super__Vector_base<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->list).
  super__Vector_base<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->gauss).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->list).
  super__Vector_base<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->gauss).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->gauss).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::resize(&this->gauss,0x100);
  lVar1 = 0;
  do {
    dVar2 = (double)((int)lVar1 + -0x80);
    dVar2 = exp(dVar2 * -0.5 * dVar2 * 0.00038446751249519417);
    (this->gauss).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar1] = (float)dVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x100);
  return;
}

Assistant:

HighDynamicRangeFusionBase::HighDynamicRangeFusionBase()
{
  // create lookup table for Gauss curve

  int n=256;
  gauss.resize(n);

  double inv_var=1.0/(51*51); // standard deviation of 0.2 for value range 0 to 1

  for (int i=0; i<n; i++)
  {
    int x=i-(n>>1);
    gauss[i]=static_cast<float>(std::exp(-0.5*x*x*inv_var));
  }
}